

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS
ref_matrix_sqrt_m(REF_DBL *m_upper_tri,REF_DBL *sqrt_m_upper_tri,REF_DBL *inv_sqrt_m_upper_tri)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_DBL d [12];
  
  uVar1 = ref_matrix_diag_m(m_upper_tri,d);
  if (uVar1 == 0) {
    if (((d[0] < 0.0) || (d[1] < 0.0)) || (d[2] < 0.0)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x218,"ref_matrix_sqrt_m","negative eigenvalues");
      printf("eigs %24.15e %24.15e %24.15e\n",d[0],d[1],d[2]);
      ref_matrix_show_m(m_upper_tri);
      uVar1 = 1;
    }
    else {
      if (d[0] < 0.0) {
        dVar2 = sqrt(d[0]);
      }
      else {
        dVar2 = SQRT(d[0]);
      }
      d[0] = dVar2;
      if (d[1] < 0.0) {
        dVar5 = sqrt(d[1]);
      }
      else {
        dVar5 = SQRT(d[1]);
      }
      d[1] = dVar5;
      if (d[2] < 0.0) {
        dVar3 = sqrt(d[2]);
      }
      else {
        dVar3 = SQRT(d[2]);
      }
      d[2] = dVar3;
      ref_matrix_form_m(d,sqrt_m_upper_tri);
      dVar4 = dVar2 * 1e+20;
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      uVar1 = 4;
      if (1.0 < dVar4) {
        d[0] = 1.0 / dVar2;
        dVar2 = dVar5 * 1e+20;
        if (dVar2 <= -dVar2) {
          dVar2 = -dVar2;
        }
        if (1.0 < dVar2) {
          d[1] = 1.0 / dVar5;
          dVar2 = dVar3 * 1e+20;
          if (dVar2 <= -dVar2) {
            dVar2 = -dVar2;
          }
          if (1.0 < dVar2) {
            d[2] = 1.0 / dVar3;
            ref_matrix_form_m(d,inv_sqrt_m_upper_tri);
            uVar1 = 0;
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x215,
           "ref_matrix_sqrt_m",(ulong)uVar1,"diag");
    ref_matrix_show_m(m_upper_tri);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_sqrt_m(REF_DBL *m_upper_tri,
                                     REF_DBL *sqrt_m_upper_tri,
                                     REF_DBL *inv_sqrt_m_upper_tri) {
  REF_DBL d[12];

  RSB(ref_matrix_diag_m(m_upper_tri, d), "diag",
      { ref_matrix_show_m(m_upper_tri); });

  if (d[0] < 0.0 || d[1] < 0.0 || d[2] < 0.0) {
    REF_WHERE("negative eigenvalues");
    printf("eigs %24.15e %24.15e %24.15e\n", d[0], d[1], d[2]);
    ref_matrix_show_m(m_upper_tri);
    return REF_FAILURE;
  }
  d[0] = sqrt(d[0]);
  d[1] = sqrt(d[1]);
  d[2] = sqrt(d[2]);

  RSS(ref_matrix_form_m(d, sqrt_m_upper_tri), "form m");

  if (!ref_math_divisible(1.0, d[0])) {
    return REF_DIV_ZERO;
  }
  d[0] = 1.0 / d[0];

  if (!ref_math_divisible(1.0, d[1])) {
    return REF_DIV_ZERO;
  }
  d[1] = 1.0 / d[1];

  if (!ref_math_divisible(1.0, d[2])) {
    return REF_DIV_ZERO;
  }
  d[2] = 1.0 / d[2];

  RSS(ref_matrix_form_m(d, inv_sqrt_m_upper_tri), "form inv m");

  return REF_SUCCESS;
}